

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RefCntAutoPtr.hpp
# Opt level: O2

void __thiscall
Diligent::RefCntAutoPtr<Diligent::FenceVkImpl>::RefCntAutoPtr
          (RefCntAutoPtr<Diligent::FenceVkImpl> *this,FenceVkImpl *pObj)

{
  this->m_pObject = pObj;
  if (pObj != (FenceVkImpl *)0x0) {
    RefCountedObject<Diligent::IFenceVk>::AddRef((RefCountedObject<Diligent::IFenceVk> *)pObj);
  }
  return;
}

Assistant:

explicit RefCntAutoPtr(T* pObj) noexcept :
        m_pObject{pObj}
    {
        if (m_pObject)
            m_pObject->AddRef();
    }